

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-sdg-dump.cpp
# Opt level: O2

void __thiscall SDGDumper::dumpToDot(SDGDumper *this,char *suffix)

{
  raw_ostream *prVar1;
  string fl;
  SDG2Dot dumper;
  allocator local_71;
  string local_70;
  SDG2Dot local_50;
  
  std::__cxx11::string::string((string *)&local_70,(string *)&this->options->inputFile);
  if (suffix == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_50,".dot",&local_71);
    replace_suffix((string *)&local_70,(string *)&local_50);
  }
  else {
    std::__cxx11::string::string((string *)&local_50,suffix,&local_71);
    replace_suffix((string *)&local_70,(string *)&local_50);
  }
  std::__cxx11::string::_M_dispose();
  prVar1 = (raw_ostream *)llvm::errs();
  prVar1 = llvm::raw_ostream::operator<<(prVar1,"Dumping SDG to ");
  prVar1 = llvm::raw_ostream::operator<<(prVar1,&local_70);
  llvm::raw_ostream::operator<<(prVar1,"\n");
  if (this->bb_only == false) {
    local_50._llvmsdg = this->dg;
    local_50.dumpedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_50.dumpedNodes._M_t._M_impl.super__Rb_tree_header._M_header;
    local_50.dumpedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_50.dumpedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_50.dumpedNodes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_50.dumpedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_50.dumpedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    dg::llvmdg::SDG2Dot::dump(&local_50,&local_70);
    std::
    _Rb_tree<dg::sdg::DGNode_*,_dg::sdg::DGNode_*,_std::_Identity<dg::sdg::DGNode_*>,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>
    ::~_Rb_tree(&local_50.dumpedNodes._M_t);
  }
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void dumpToDot(const char *suffix = nullptr) {
        // compose new name
        std::string fl(options.inputFile);
        if (suffix)
            replace_suffix(fl, suffix);
        else
            replace_suffix(fl, ".dot");

        errs() << "Dumping SDG to " << fl << "\n";

        if (bb_only) {
            assert(false && "Not implemented");
            // SDGDumpBlocks dumper(dg, dump_opts, fl.c_str());
            // dumper.dump();
        } else {
            llvmdg::SDG2Dot dumper(dg);
            dumper.dump(fl);
        }
    }